

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O2

shared_ptr<dap::ReaderWriter> __thiscall
dap::ReaderWriter::create(ReaderWriter *this,shared_ptr<dap::Reader> *r,shared_ptr<dap::Writer> *w)

{
  Writer WVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<dap::ReaderWriter> sVar2;
  __allocator_type __a2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::RW,_std::allocator<(anonymous_namespace)::RW>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_40;
  
  WVar1 = (Writer)operator_new(0x40);
  local_40._M_alloc = &__a2;
  *(undefined8 *)((long)WVar1 + 8) = 0x100000001;
  *(undefined ***)WVar1 = &PTR___Sp_counted_ptr_inplace_0093bc90;
  *(undefined ***)((long)WVar1 + 0x10) = &PTR__Closable_0092be50;
  ReaderWriter((ReaderWriter *)((long)WVar1 + 0x10),&PTR_PTR_0093bd90);
  *(undefined ***)((long)WVar1 + 0x10) = &PTR__RW_0093bd00;
  *(undefined ***)((long)WVar1 + 0x18) = &PTR__RW_0093bd60;
  std::__shared_ptr<dap::Reader,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<dap::Reader,_(__gnu_cxx::_Lock_policy)2> *)((long)WVar1 + 0x20),
             &r->super___shared_ptr<dap::Reader,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<dap::Writer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<dap::Writer,_(__gnu_cxx::_Lock_policy)2> *)((long)WVar1 + 0x30),
             &w->super___shared_ptr<dap::Writer,_(__gnu_cxx::_Lock_policy)2>);
  local_40._M_ptr = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::RW,_std::allocator<(anonymous_namespace)::RW>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_40);
  this->super_Reader = (Reader)((long)WVar1 + 0x10);
  local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->super_Writer = WVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
  sVar2.super___shared_ptr<dap::ReaderWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<dap::ReaderWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<dap::ReaderWriter>)
         sVar2.super___shared_ptr<dap::ReaderWriter,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ReaderWriter> ReaderWriter::create(
    const std::shared_ptr<Reader>& r,
    const std::shared_ptr<Writer>& w) {
  return std::make_shared<RW>(r, w);
}